

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.cpp
# Opt level: O2

bool __thiscall
duckdb::CSVSchema::SchemasMatch
          (CSVSchema *this,string *error_message,SnifferResult *sniffer_result,string *cur_file_path
          ,bool is_minimal_sniffer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__k;
  pointer pCVar1;
  bool bVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  iterator iVar8;
  pointer pCVar9;
  ulong __n;
  size_type __n_00;
  idx_t return_type_idx;
  LogicalType *this_00;
  size_type __n_01;
  vector<duckdb::CSVColumnInfo,_true> *__range3;
  string local_218;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>_>
  current_schema;
  LogicalType local_1c0;
  ostringstream error;
  bool local_178;
  
  current_schema._M_h._M_buckets = &current_schema._M_h._M_single_bucket;
  current_schema._M_h._M_bucket_count = 1;
  current_schema._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  current_schema._M_h._M_element_count = 0;
  current_schema._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  current_schema._M_h._M_rehash_policy._M_next_resize = 0;
  current_schema._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (__n = 0; __n < (ulong)((long)(sniffer_result->names).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(sniffer_result->names).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1)
  {
    pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(&sniffer_result->return_types,__n);
    LogicalType::LogicalType(&local_1c0,pvVar4);
    LogicalType::LogicalType((LogicalType *)&error,&local_1c0);
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&sniffer_result->names,__n);
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&current_schema,pvVar5);
    TypeIdxPair::operator=(pmVar6,(TypeIdxPair *)&error);
    LogicalType::~LogicalType((LogicalType *)&error);
    LogicalType::~LogicalType(&local_1c0);
  }
  if (is_minimal_sniffer) {
    AdaptiveSnifferResult::AdaptiveSnifferResult
              ((AdaptiveSnifferResult *)&error,(AdaptiveSnifferResult *)sniffer_result);
    if (local_178 == false) {
      pCVar9 = (this->columns).
               super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
               super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pCVar1 = (this->columns).
               super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
               super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pCVar9 == pCVar1) goto LAB_00abcbde;
        iVar8 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&current_schema._M_h,&pCVar9->name);
        pCVar9 = pCVar9 + 1;
      } while (iVar8.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_true>
               ._M_cur != (__node_type *)0x0);
      pCVar9 = (this->columns).
               super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
               super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pCVar1 = (this->columns).
               super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
               super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (((long)(sniffer_result->return_types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(sniffer_result->return_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18 ==
          ((long)pCVar1 - (long)pCVar9) / 0x38) {
        __n_01 = 0;
        do {
          if (pCVar9 == pCVar1) {
            pCVar1 = (this->columns).
                     super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
                     super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            __n_00 = 0;
            for (pCVar9 = (this->columns).
                          super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                          .
                          super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start; pCVar9 != pCVar1;
                pCVar9 = pCVar9 + 1) {
              pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::get<true>(&sniffer_result->names,__n_00);
              ::std::__cxx11::string::_M_assign((string *)pvVar5);
              __n_00 = __n_00 + 1;
            }
LAB_00abcbde:
            SnifferResult::~SnifferResult((SnifferResult *)&error);
            bVar3 = true;
            goto LAB_00abcaf6;
          }
          pvVar4 = vector<duckdb::LogicalType,_true>::get<true>
                             (&sniffer_result->return_types,__n_01);
          bVar3 = LogicalType::operator!=(&pCVar9->type,pvVar4);
          pCVar9 = pCVar9 + 1;
          __n_01 = __n_01 + 1;
        } while (!bVar3);
      }
    }
    SnifferResult::~SnifferResult((SnifferResult *)&error);
  }
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  poVar7 = ::std::operator<<((ostream *)&error,"Schema mismatch between globbed files.");
  ::std::operator<<(poVar7,anon_var_dwarf_4b71d2e + 8);
  poVar7 = ::std::operator<<((ostream *)&error,"Main file schema: ");
  poVar7 = ::std::operator<<(poVar7,(string *)&this->file_path);
  ::std::operator<<(poVar7,anon_var_dwarf_4b71d2e + 8);
  poVar7 = ::std::operator<<((ostream *)&error,"Current file: ");
  poVar7 = ::std::operator<<(poVar7,(string *)cur_file_path);
  ::std::operator<<(poVar7,anon_var_dwarf_4b71d2e + 8);
  pCVar9 = (this->columns).
           super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
           super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl
           .super__Vector_impl_data._M_finish;
  this_00 = &((this->columns).
              super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
              super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->type;
  bVar3 = true;
  do {
    __k = &this_00[-2].type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if ((pointer)__k == pCVar9) {
      ::std::operator<<((ostream *)&error,
                        "Potential Fix: Since your schema has a mismatch, consider setting union_by_name=true."
                       );
      if (!bVar3) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)error_message,(string *)&local_218);
        ::std::__cxx11::string::~string((string *)&local_218);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
LAB_00abcaf6:
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&current_schema._M_h);
      return bVar3;
    }
    iVar8 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&current_schema._M_h,(key_type *)__k);
    if (iVar8.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_true>
        ._M_cur == (__node_type *)0x0) {
      poVar7 = ::std::operator<<((ostream *)&error,"Column with name: \"");
      poVar7 = ::std::operator<<(poVar7,(string *)__k);
      poVar7 = ::std::operator<<(poVar7,"\" is missing");
      ::std::operator<<(poVar7,anon_var_dwarf_4b71d2e + 8);
LAB_00abca97:
      bVar3 = false;
    }
    else {
      pmVar6 = ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&current_schema._M_h,(key_type *)__k);
      bVar2 = CanWeCastIt((pmVar6->type).id_,this_00->id_);
      if (!bVar2) {
        poVar7 = ::std::operator<<((ostream *)&error,"Column with name: \"");
        poVar7 = ::std::operator<<(poVar7,(string *)__k);
        poVar7 = ::std::operator<<(poVar7,"\" is expected to have type: ");
        LogicalType::ToString_abi_cxx11_(&local_218,this_00);
        ::std::operator<<(poVar7,(string *)&local_218);
        ::std::__cxx11::string::~string((string *)&local_218);
        poVar7 = ::std::operator<<((ostream *)&error," But has type: ");
        pmVar6 = ::std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::TypeIdxPair>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&current_schema._M_h,(key_type *)__k);
        LogicalType::ToString_abi_cxx11_(&local_218,&pmVar6->type);
        poVar7 = ::std::operator<<(poVar7,(string *)&local_218);
        ::std::operator<<(poVar7,anon_var_dwarf_4b71d2e + 8);
        ::std::__cxx11::string::~string((string *)&local_218);
        goto LAB_00abca97;
      }
    }
    this_00 = (LogicalType *)&this_00[2].type_info_;
  } while( true );
}

Assistant:

bool CSVSchema::SchemasMatch(string &error_message, SnifferResult &sniffer_result, const string &cur_file_path,
                             bool is_minimal_sniffer) const {
	D_ASSERT(sniffer_result.names.size() == sniffer_result.return_types.size());
	bool match = true;
	unordered_map<string, TypeIdxPair> current_schema;

	for (idx_t i = 0; i < sniffer_result.names.size(); i++) {
		// Populate our little schema
		current_schema[sniffer_result.names[i]] = {sniffer_result.return_types[i], i};
	}
	if (is_minimal_sniffer) {
		auto min_sniffer = static_cast<AdaptiveSnifferResult &>(sniffer_result);
		if (!min_sniffer.more_than_one_row) {
			bool min_sniff_match = true;
			// If we don't have more than one row, either the names must match or the types must match.
			for (auto &column : columns) {
				if (current_schema.find(column.name) == current_schema.end()) {
					min_sniff_match = false;
					break;
				}
			}
			if (min_sniff_match) {
				return true;
			}
			// Otherwise, the types must match.
			min_sniff_match = true;
			if (sniffer_result.return_types.size() == columns.size()) {
				idx_t return_type_idx = 0;
				for (auto &column : columns) {
					if (column.type != sniffer_result.return_types[return_type_idx++]) {
						min_sniff_match = false;
						break;
					}
				}
			} else {
				min_sniff_match = false;
			}
			if (min_sniff_match) {
				// If we got here, we have the right types but the wrong names, lets fix the names
				idx_t sniff_name_idx = 0;
				for (auto &column : columns) {
					sniffer_result.names[sniff_name_idx++] = column.name;
				}
				return true;
			}
		}
		// If we got to this point, the minimal sniffer doesn't match, we throw an error.
	}
	// Here we check if the schema of a given file matched our original schema
	// We consider it's not a match if:
	// 1. The file misses columns that were defined in the original schema.
	// 2. They have a column match, but the types do not match.
	std::ostringstream error;
	error << "Schema mismatch between globbed files."
	      << "\n";
	error << "Main file schema: " << file_path << "\n";
	error << "Current file: " << cur_file_path << "\n";

	for (auto &column : columns) {
		if (current_schema.find(column.name) == current_schema.end()) {
			error << "Column with name: \"" << column.name << "\" is missing"
			      << "\n";
			match = false;
		} else {
			if (!CanWeCastIt(current_schema[column.name].type.id(), column.type.id())) {
				error << "Column with name: \"" << column.name
				      << "\" is expected to have type: " << column.type.ToString();
				error << " But has type: " << current_schema[column.name].type.ToString() << "\n";
				match = false;
			}
		}
	}

	// Lets suggest some potential fixes
	error << "Potential Fix: Since your schema has a mismatch, consider setting union_by_name=true.";
	if (!match) {
		error_message = error.str();
	}
	return match;
}